

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O3

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::FirewallOperator::process
          (FirewallOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  Message *__ptr;
  char cVar1;
  default_delete<helics::Message> *in_RDX;
  
  if (message[3]._M_t.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
      _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
      super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl == (Message *)0x0)
  goto switchD_00288107_default;
  cVar1 = (*(code *)message[4]._M_t.
                    super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                    .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)(message + 1);
  switch(*(undefined4 *)
          &message[5]._M_t.
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl) {
  case 0:
    if (cVar1 == '\0') break;
    goto LAB_00288140;
  case 1:
    if (cVar1 != '\0') break;
LAB_00288140:
    __ptr = *(Message **)in_RDX;
    *(undefined8 *)in_RDX = 0;
    if (__ptr != (Message *)0x0) {
      std::default_delete<helics::Message>::operator()(in_RDX,__ptr);
    }
    break;
  case 2:
    if (cVar1 != '\0') {
      *(ushort *)(*(long *)in_RDX + 8) = *(ushort *)(*(long *)in_RDX + 8) | 0x400;
    }
    break;
  case 3:
    if (cVar1 != '\0') {
      *(ushort *)(*(long *)in_RDX + 8) = *(ushort *)(*(long *)in_RDX + 8) | 0x2000;
    }
    break;
  case 4:
    if (cVar1 != '\0') {
      *(ushort *)(*(long *)in_RDX + 8) = *(ushort *)(*(long *)in_RDX + 8) | 0x4000;
    }
  }
switchD_00288107_default:
  (this->super_FilterOperator)._vptr_FilterOperator = *(_func_int ***)in_RDX;
  *(undefined8 *)in_RDX = 0;
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> FirewallOperator::process(std::unique_ptr<Message> message)
{
    if (checkFunction) {
        bool res = checkFunction(message.get());
        switch (operation) {
            case operations::drop:
                if (res) {
                    message = nullptr;
                }
                break;
            case operations::pass:
                if (!res) {
                    message = nullptr;
                }
                break;
            case operations::set_flag1:
                if (res) {
                    setActionFlag(*message, user_custom_message_flag1);
                }
                break;
            case operations::set_flag2:
                if (res) {
                    setActionFlag(*message, user_custom_message_flag2);
                }
                break;
            case operations::set_flag3:
                if (res) {
                    setActionFlag(*message, user_custom_message_flag3);
                }
                break;
            case operations::none:
                break;
        }
    }
    return message;
}